

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

link_map * get_vdso_from_auxv(void)

{
  long local_30;
  Elf64_Addr vdso_dynamic;
  Elf64_Half p;
  Elf64_Half vdso_phdr_num;
  Elf64_Phdr *vdso_phdrs;
  link_map *m;
  
  local_30 = 0;
  parse_auxv_contents();
  if (vdso_ehdr != (Elf64_Ehdr *)0x0) {
    for (vdso_dynamic._4_2_ = 0; vdso_dynamic._4_2_ < vdso_ehdr->e_phnum;
        vdso_dynamic._4_2_ = vdso_dynamic._4_2_ + 1) {
      if (*(int *)(vdso_ehdr->e_ident + (ulong)vdso_dynamic._4_2_ * 0x38 + vdso_ehdr->e_phoff) == 2)
      {
        local_30 = *(long *)(vdso_ehdr->e_ident +
                            (ulong)vdso_dynamic._4_2_ * 0x38 + vdso_ehdr->e_phoff + 0x10);
      }
    }
    for (vdso_phdrs = ___throw_regex_error; vdso_phdrs != (Elf64_Phdr *)0x0;
        vdso_phdrs = (Elf64_Phdr *)vdso_phdrs->p_paddr) {
      if (*(long *)vdso_phdrs + local_30 == vdso_phdrs->p_vaddr) {
        return (link_map *)vdso_phdrs;
      }
    }
  }
  return (link_map *)0x0;
}

Assistant:

struct link_map *get_vdso_from_auxv() {
  struct link_map *m = NULL;

  ElfW(Phdr) *vdso_phdrs = NULL;
  ElfW(Half) vdso_phdr_num, p;
  ElfW(Addr) vdso_dynamic = 0;

  parse_auxv_contents();
  if (vdso_ehdr) {
    vdso_phdrs =
        (ElfW(Phdr) *)(vdso_ehdr->e_phoff + ((unsigned char *)vdso_ehdr));
    vdso_phdr_num = vdso_ehdr->e_phnum;

    for (p = 0; p < vdso_phdr_num; p++) {
      if (vdso_phdrs[p].p_type == PT_DYNAMIC) {
        vdso_dynamic = (ElfW(Addr))vdso_phdrs[p].p_vaddr;
      }
    }

    for (m = _r_debug.r_map; m; m = m->l_next) {
      if (m->l_addr + vdso_dynamic == (ElfW(Addr))m->l_ld) {
        return m;
      }
    }
  }
  return NULL;  // GCOVR_EXCL_LINE
}